

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

int __thiscall QTextDocumentPrivate::undoRedo(QTextDocumentPrivate *this,bool undo)

{
  BlockMap *this_00;
  pointer pQVar1;
  ushort uVar2;
  quint32 pos;
  _func_int **pp_Var3;
  QTextBlockData *pQVar4;
  Header *pHVar5;
  QTextUndoCommand *pQVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  pointer pQVar13;
  long *plVar14;
  long *plVar15;
  long lVar16;
  QTextObject *obj;
  bool bVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint pos_00;
  long in_FS_OFFSET;
  int local_98;
  QTextFormat local_68;
  undefined1 local_58 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar19 = 0xffffffff;
  if (((this->undoEnabled == true) && (uVar8 = this->undoState, !undo || uVar8 != 0)) &&
     ((undo || ((this->undoStack).d.size != (long)(int)uVar8)))) {
    this->undoEnabled = false;
    iVar12 = this->editBlock;
    this->editBlock = iVar12 + 1;
    if (iVar12 == 0) {
      this->revision = this->revision + 1;
    }
    this_00 = &this->blocks;
    local_98 = -1;
    do {
      if (undo) {
        uVar8 = uVar8 - 1;
        this->undoState = uVar8;
      }
      pQVar13 = QList<QTextUndoCommand>::data(&this->undoStack);
      pQVar1 = pQVar13 + (int)uVar8;
      pos_00 = pQVar13[(int)uVar8].pos;
      uVar2 = pQVar13[(int)uVar8].command;
      iVar12 = (int)&this->formats;
      switch(uVar2) {
      case 0:
        remove(this,(char *)(ulong)pos_00);
        pQVar1->command = 1;
        goto LAB_004d3376;
      case 1:
        insert_string(this,pos_00,pQVar1->strPos,(pQVar1->field_8).length,pQVar1->format,
                      (uint)pQVar1->operation);
        pQVar1->command = 0;
        uVar20 = pQVar1->pos;
        if (uVar19 != uVar20) {
          local_98 = 0;
        }
        local_98 = local_98 + (pQVar1->field_8).blockFormat;
        break;
      case 2:
        uVar10 = QFragmentMapData<QTextFragmentData>::findNode(&(this->fragments).data,pos_00,0);
        iVar11 = (this->fragments).data.field_0.fragments[uVar10].format;
        pos = pQVar1->pos;
        iVar9 = (pQVar1->field_8).blockFormat;
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar12);
        QTextFormat::toCharFormat((QTextFormat *)local_58);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        setCharFormat(this,pos,iVar9,(QTextCharFormat *)local_58,SetFormat);
        QTextFormat::~QTextFormat((QTextFormat *)local_58);
        pQVar1->format = iVar11;
        uVar20 = pQVar1->pos;
        if (uVar19 != uVar20) {
          local_98 = 0;
        }
        local_98 = local_98 + (pQVar1->field_8).blockFormat;
        goto LAB_004d348c;
      case 3:
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        uVar10 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pQVar1->pos,0);
        local_58._8_4_ = uVar10;
        pQVar4 = (this->blocks).data.field_0.fragments;
        iVar11 = pQVar4[uVar10].format;
        pQVar4[uVar10].format = pQVar1->format;
        local_58._0_8_ = this;
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar12);
        QTextFormat::toBlockFormat(&local_68);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        iVar9 = QTextFormat::objectIndex(&local_68);
        objectForIndex(this,iVar9);
        plVar14 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
        QTextFormat::~QTextFormat(&local_68);
        QTextFormatCollection::format((QTextFormatCollection *)&stack0xffffffffffffffb8,iVar12);
        QTextFormat::toBlockFormat(&local_68);
        QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
        iVar12 = QTextFormat::objectIndex(&local_68);
        objectForIndex(this,iVar12);
        plVar15 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
        QTextFormat::~QTextFormat(&local_68);
        pQVar1->format = iVar11;
        if (plVar15 == plVar14) {
          lVar16 = 0x70;
        }
        else {
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 0x68))(plVar14,local_58);
          }
          lVar16 = 0x60;
          plVar14 = plVar15;
        }
        if (plVar14 != (long *)0x0) {
          (**(code **)(*plVar15 + lVar16))(plVar15,(QTextBlock *)local_58);
        }
        iVar12 = QTextBlock::position((QTextBlock *)local_58);
        iVar11 = QTextBlock::length((QTextBlock *)local_58);
        documentChange(this,iVar12,iVar11);
        goto LAB_004d3486;
      case 4:
      case 6:
        remove_block(this,pos_00,&(pQVar1->field_8).blockFormat,(uint)uVar2,(uint)pQVar1->operation)
        ;
        pQVar1->command = (ushort)(pQVar1->command != 4) * 2 + 5;
LAB_004d3376:
        uVar20 = pQVar1->pos;
        local_98 = 0;
        break;
      case 5:
      case 7:
        insert_block(this,pos_00,pQVar1->strPos,pQVar1->format,(pQVar1->field_8).blockFormat,
                     (uint)pQVar1->operation,(uint)uVar2);
        pos_00 = pos_00 + 1;
        pQVar1->command = (ushort)(pQVar1->command != 5) * 2 + 4;
        uVar20 = pQVar1->pos;
        local_98 = local_98 + 1;
        if (uVar19 != uVar20) {
          local_98 = 1;
        }
        break;
      case 8:
        obj = objectForIndex(this,(pQVar1->field_8).blockFormat);
        iVar12 = QTextFormatCollection::objectFormatIndex
                           (&this->formats,(pQVar1->field_8).blockFormat);
        changeObjectFormat(this,obj,pQVar1->format);
        pQVar1->format = iVar12;
LAB_004d3486:
        uVar20 = 0xffffffff;
        goto LAB_004d348c;
      case 9:
        local_98 = 0;
        uVar20 = pos_00;
        break;
      default:
        uVar20 = uVar19;
        if (uVar2 != 0x100) break;
        pp_Var3 = ((pQVar1->field_8).custom)->_vptr_QAbstractUndoItem;
        if (!undo) {
          (*pp_Var3[3])();
          uVar20 = 0xffffffff;
          goto LAB_004d3499;
        }
        (*pp_Var3[2])();
        uVar20 = 0xffffffff;
        goto LAB_004d3491;
      }
      if (-1 < (int)pos_00) {
        uVar10 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,pos_00,0);
        pHVar5 = (this_00->data).field_0.head;
        *(uint *)((long)pHVar5 + (ulong)uVar10 * 0x48 + 0x44) =
             *(uint *)((long)pHVar5 + (ulong)uVar10 * 0x48 + 0x44) & 0x80000000 |
             pQVar1->revision & 0x7fffffff;
      }
LAB_004d348c:
      if (undo) {
LAB_004d3491:
        uVar8 = this->undoState;
      }
      else {
LAB_004d3499:
        uVar8 = this->undoState + 1;
        this->undoState = uVar8;
      }
      if (((int)uVar8 < 1) || (uVar18 = (ulong)uVar8, (ulong)(this->undoStack).d.size <= uVar18))
      goto LAB_004d34d8;
      pQVar6 = (this->undoStack).d.ptr;
      if (((pQVar6[uVar18].field_0x2 & 1) == 0) ||
         (uVar19 = uVar20, (pQVar6[uVar18 - 1].field_0x2 & 3) != 1)) goto LAB_004d34d8;
    } while( true );
  }
LAB_004d3584:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar19;
LAB_004d34d8:
  this->undoEnabled = true;
  if ((int)uVar20 < 0) {
    if (this->docChangeFrom < 0) {
      uVar19 = 0xffffffff;
    }
    else {
      uVar8 = this->docChangeFrom + this->docChangeLength;
      iVar12 = QFragmentMapData<QTextFragmentData>::length(&(this->fragments).data,0);
      uVar19 = iVar12 - 1U;
      if ((int)uVar8 < (int)(iVar12 - 1U)) {
        uVar19 = uVar8;
      }
    }
  }
  else {
    uVar19 = uVar20 + local_98;
  }
  endEditBlock(this);
  bVar7 = this->undoEnabled;
  bVar17 = (bool)(0 < this->undoState & bVar7);
  if (this->wasUndoAvailable != bVar17) {
    QTextDocument::undoAvailable(*(QTextDocument **)&this->field_0x8,bVar17);
    this->wasUndoAvailable = bVar17;
    bVar7 = this->undoEnabled;
  }
  if ((bVar7 & 1) == 0) {
    bVar17 = false;
  }
  else {
    bVar17 = (long)this->undoState < (this->undoStack).d.size;
  }
  if (this->wasRedoAvailable != bVar17) {
    QTextDocument::redoAvailable(*(QTextDocument **)&this->field_0x8,bVar17);
    this->wasRedoAvailable = bVar17;
  }
  goto LAB_004d3584;
}

Assistant:

int QTextDocumentPrivate::undoRedo(bool undo)
{
    PMDEBUG("%s, undoState=%d, undoStack size=%d", undo ? "undo:" : "redo:", undoState, int(undoStack.size()));
    if (!undoEnabled || (undo && undoState == 0) || (!undo && undoState == undoStack.size()))
        return -1;

    undoEnabled = false;
    beginEditBlock();
    int editPos = -1;
    int editLength = -1;
    while (1) {
        if (undo)
            --undoState;
        QTextUndoCommand &c = undoStack[undoState];
        int resetBlockRevision = c.pos;

        switch (c.command) {
        case QTextUndoCommand::Inserted:
            remove(c.pos, c.length, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   erase: from %d, length %d", c.pos, c.length);
            c.command = QTextUndoCommand::Removed;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Removed:
            PMDEBUG("   insert: format %d (from %d, length %d, strpos=%d)", c.format, c.pos, c.length, c.strPos);
            insert_string(c.pos, c.strPos, c.length, c.format, (QTextUndoCommand::Operation)c.operation);
            c.command = QTextUndoCommand::Inserted;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        case QTextUndoCommand::BlockInserted:
        case QTextUndoCommand::BlockAdded:
            remove_block(c.pos, &c.blockFormat, c.command, (QTextUndoCommand::Operation)c.operation);
            PMDEBUG("   blockremove: from %d", c.pos);
            if (c.command == QTextUndoCommand::BlockInserted)
                c.command = QTextUndoCommand::BlockRemoved;
            else
                c.command = QTextUndoCommand::BlockDeleted;
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::BlockRemoved:
        case QTextUndoCommand::BlockDeleted:
            PMDEBUG("   blockinsert: charformat %d blockformat %d (pos %d, strpos=%d)", c.format, c.blockFormat, c.pos, c.strPos);
            insert_block(c.pos, c.strPos, c.format, c.blockFormat, (QTextUndoCommand::Operation)c.operation, c.command);
            resetBlockRevision += 1;
            if (c.command == QTextUndoCommand::BlockRemoved)
                c.command = QTextUndoCommand::BlockInserted;
            else
                c.command = QTextUndoCommand::BlockAdded;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += 1;
            break;
        case QTextUndoCommand::CharFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   charFormat: format %d (from %d, length %d)", c.format, c.pos, c.length);
            FragmentIterator it = find(c.pos);
            Q_ASSERT(!it.atEnd());

            int oldFormat = it.value()->format;
            setCharFormat(c.pos, c.length, formats.charFormat(c.format));
            c.format = oldFormat;
            if (editPos != (int)c.pos)
                editLength = 0;
            editPos = c.pos;
            editLength += c.length;
            break;
        }
        case QTextUndoCommand::BlockFormatChanged: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   blockformat: format %d pos %d", c.format, c.pos);
            QTextBlock it = blocksFind(c.pos);
            Q_ASSERT(it.isValid());

            int oldFormat = block(it)->format;
            block(it)->format = c.format;
            QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(oldFormat)));
            QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(formats.blockFormat(c.format)));
            c.format = oldFormat;
            if (group != oldGroup) {
                if (oldGroup)
                    oldGroup->blockRemoved(it);
                if (group)
                    group->blockInserted(it);
            } else if (group) {
                group->blockFormatChanged(it);
            }
            documentChange(it.position(), it.length());
            editPos = -1;
            break;
        }
        case QTextUndoCommand::GroupFormatChange: {
            resetBlockRevision = -1; // ## TODO
            PMDEBUG("   group format change");
            QTextObject *object = objectForIndex(c.objectIndex);
            int oldFormat = formats.objectFormatIndex(c.objectIndex);
            changeObjectFormat(object, c.format);
            c.format = oldFormat;
            editPos = -1;
            break;
        }
        case QTextUndoCommand::CursorMoved:
            editPos = c.pos;
            editLength = 0;
            break;
        case QTextUndoCommand::Custom:
            resetBlockRevision = -1; // ## TODO
            if (undo)
                c.custom->undo();
            else
                c.custom->redo();
            editPos = -1;
            break;
        default:
            Q_ASSERT(false);
        }

        if (resetBlockRevision >= 0) {
            int b = blocks.findNode(resetBlockRevision);
            QTextBlockData *B = blocks.fragment(b);
            B->revision = c.revision;
        }

        if (!undo)
            ++undoState;

        bool inBlock = (
                undoState > 0
                && undoState < undoStack.size()
                && undoStack.at(undoState).block_part
                && undoStack.at(undoState - 1).block_part
                && !undoStack.at(undoState - 1).block_end
                );
        if (!inBlock)
            break;
    }
    undoEnabled = true;

    int newCursorPos = -1;

    if (editPos >=0)
        newCursorPos = editPos + editLength;
    else if (docChangeFrom >= 0)
        newCursorPos= qMin(docChangeFrom + docChangeLength, length() - 1);

    endEditBlock();
    emitUndoAvailable(isUndoAvailable());
    emitRedoAvailable(isRedoAvailable());

    return newCursorPos;
}